

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::AddPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  void *pvVar1;
  wally_tx_witness_stack *pwVar2;
  uchar *witness;
  pointer pCVar3;
  wally_tx_witness_stack *pwVar4;
  int iVar5;
  CfdException *this_01;
  uchar *witness_len;
  ulong uVar6;
  int ret;
  wally_tx_witness_stack *stack_pointer;
  string function_name;
  int local_8c;
  wally_tx_witness_stack *local_88;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_60 = data;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6cd,"AddPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar6 = (ulong)tx_in_index;
  if (uVar6 < *(ulong *)((long)pvVar1 + 0x10)) {
    local_8c = 0;
    local_88 = (wally_tx_witness_stack *)0x0;
    local_80._0_8_ = &local_70;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"wally_tx_witness_stack_init_alloc","");
    local_38 = uVar6 * 0xd0;
    pwVar2 = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + local_38);
    pwVar4 = pwVar2;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) &&
       (local_8c = wally_tx_witness_stack_init_alloc(1,&local_88), pwVar4 = local_88, local_8c != 0)
       ) {
LAB_0039370d:
      local_58._0_8_ = "cfdcore_elements_transaction.cpp";
      local_58._8_4_ = 0x6fa;
      local_48._M_allocated_capacity = 0x617eae;
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_8c);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = &local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"witness stack error.","");
      CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_58);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_88 = pwVar4;
    ::std::__cxx11::string::_M_replace((ulong)local_80,0,(char *)local_80._8_8_,0x613100);
    witness = (local_60->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (local_60->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    iVar5 = wally_tx_witness_stack_add(local_88,witness,(size_t)witness_len);
    local_8c = iVar5;
    if ((pwVar2 == (wally_tx_witness_stack *)0x0) && (iVar5 == 0)) {
      *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + local_38) = local_88;
      local_88 = (wally_tx_witness_stack *)0x0;
    }
    else {
      if (local_88 != (wally_tx_witness_stack *)0x0 && pwVar2 == (wally_tx_witness_stack *)0x0) {
        wally_tx_witness_stack_free(local_88);
      }
      if (iVar5 != 0) goto LAB_0039370d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._0_8_ != &local_70) {
      operator_delete((void *)local_80._0_8_,local_70._M_allocated_capacity + 1);
    }
  }
  SetElementsTxState(this);
  pCVar3 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)local_58,local_60);
  ScriptWitness::AddWitnessStack(&pCVar3[uVar6].pegin_witness_,(ByteData *)local_58);
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_80 + 8);
  local_80._0_8_ = &PTR__ScriptWitness_0086dc20;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (this_00,&pCVar3[uVar6].pegin_witness_.witness_stack_);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0086dc20;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,this_00);
  local_80._0_8_ = &PTR__ScriptWitness_0086dc20;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::AddPeginWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].pegin_witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          tx_pointer->inputs[tx_in_index].pegin_witness = stack_pointer;
          stack_pointer = nullptr;
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].AddPeginWitnessStack(ByteData(data));
  return witness;
}